

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoViableAltException.cpp
# Opt level: O0

string * __thiscall NoViableAltException::getErrorMessage_abi_cxx11_(NoViableAltException *this)

{
  Token *pTVar1;
  AST *pAVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [48];
  
  pTVar1 = RefCount::operator_cast_to_Token_((RefCount *)(in_RSI + 0x30));
  if (pTVar1 == (Token *)0x0) {
    pAVar2 = RefCount::operator_cast_to_AST_((RefCount *)(in_RSI + 0x38));
    if (pAVar2 == (AST *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(in_RDI,"unexpected end of subtree",&local_69);
      std::allocator<char>::~allocator((allocator<char> *)&local_69);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_90,"unexpected AST node: ",&local_91);
      pAVar2 = RefCount<AST>::operator->((RefCount<AST> *)(in_RSI + 0x38));
      AST::toString_abi_cxx11_(pAVar2);
      std::operator+(in_stack_ffffffffffffff48,in_RSI);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff48);
      std::__cxx11::string::~string(local_90);
      std::allocator<char>::~allocator((allocator<char> *)&local_91);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"unexpected token: ",&local_31);
    pTVar1 = RefCount<Token>::operator->((RefCount<Token> *)(in_RSI + 0x30));
    (*pTVar1->_vptr_Token[2])(local_68);
    std::operator+(in_stack_ffffffffffffff48,in_RSI);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  return in_RDI;
}

Assistant:

std::string NoViableAltException::getErrorMessage() const
{
	if (token)
		return std::string("unexpected token: ")+token->getText();

	// must a tree parser error if token==null
	if (!node) {
		return "unexpected end of subtree";
	}
	return std::string("unexpected AST node: ")+node->toString();
}